

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnLocalNameLocalCount
          (BinaryReaderIR *this,Index index,Index count)

{
  pointer ppFVar1;
  Index IVar2;
  
  ppFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3)) {
    IVar2 = Func::GetNumParamsAndLocals(ppFVar1[index]);
    if (IVar2 < count) {
      PrintError(this,"expected local name count (%u) <= local count (%u)",(ulong)count,(ulong)IVar2
                );
    }
    return (Result)(uint)(IVar2 < count);
  }
  __assert_fail("index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader-ir.cc"
                ,0x493,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnLocalNameLocalCount(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnLocalNameLocalCount(Index index, Index count) {
  assert(index < module_->funcs.size());
  Func* func = module_->funcs[index];
  Index num_params_and_locals = func->GetNumParamsAndLocals();
  if (count > num_params_and_locals) {
    PrintError("expected local name count (%" PRIindex
               ") <= local count (%" PRIindex ")",
               count, num_params_and_locals);
    return Result::Error;
  }
  return Result::Ok;
}